

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

longdouble *
calc_sd_right_to_left_weighted<float,std::vector<double,std::allocator<double>>,long_double>
          (float *x,float xmean,size_t *ix_arr,size_t st,size_t end,double *sd_arr,
          vector<double,_std::allocator<double>_> *w,longdouble *cumw)

{
  float fVar1;
  longdouble lVar2;
  reference pvVar3;
  longdouble *extraout_RAX;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  vector<double,_std::allocator<double>_> *in_R9;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar4;
  float in_XMM0_Da;
  longdouble *in_stack_00000008;
  size_t row;
  double w_this;
  longdouble cnt;
  size_t n;
  float mean_prev;
  longdouble running_ssq;
  longdouble running_mean;
  unkbyte10 local_bc;
  undefined8 local_88;
  unkbyte10 local_78;
  undefined4 local_5c;
  unkbyte10 local_48;
  
  local_78 = (longdouble)0;
  local_5c = *(float *)(in_RDI + *(long *)(in_RSI + in_RCX * 8) * 4) - in_XMM0_Da;
  local_48 = local_78;
  for (local_88 = 0; local_88 < (ulong)(in_RCX - in_RDX); local_88 = local_88 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_R9,*(size_type *)(in_RSI + (in_RCX - local_88) * 8));
    local_78 = local_78 + (longdouble)*pvVar3;
    local_48 = ((longdouble)*pvVar3 *
               ((longdouble)
                (*(float *)(in_RDI + *(long *)(in_RSI + (in_RCX - local_88) * 8) * 4) - in_XMM0_Da)
               - local_48)) / local_78 + local_48;
    local_5c = (float)local_48;
    if (local_88 == 0) {
      local_bc = (longdouble)0;
      lVar2 = in_ST0;
    }
    else {
      lVar4 = in_ST4;
      std::sqrt((double)(ulong)(uint)local_5c);
      lVar2 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = lVar4;
      local_bc = in_ST0;
    }
    in_ST0 = lVar2;
    *(double *)(in_R8 + ((in_RCX - in_RDX) - local_88) * 8) = (double)local_bc;
  }
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     (in_R9,*(size_type *)(in_RSI + in_RDX * 8));
  fVar1 = *(float *)(in_RDI + *(long *)(in_RSI + in_RDX * 8) * 4);
  *in_stack_00000008 = local_78 + (longdouble)*pvVar3;
  std::sqrt((double)(ulong)(uint)((fVar1 - in_XMM0_Da) - local_5c));
  return extraout_RAX;
}

Assistant:

ldouble_safe calc_sd_right_to_left_weighted(real_t_ *restrict x, real_t_ xmean, size_t ix_arr[], size_t st, size_t end,
                                           double *restrict sd_arr, mapping &restrict w, ldouble_safe &cumw)
{
    ldouble_safe running_mean = 0;
    ldouble_safe running_ssq = 0;
    real_t_ mean_prev = x[ix_arr[end]] - xmean;
    size_t n = end - st + 1;
    ldouble_safe cnt = 0;
    double w_this;
    for (size_t row = 0; row < n-1; row++)
    {
        w_this = w[ix_arr[end-row]];
        cnt += w_this;
        running_mean   += w_this * ((x[ix_arr[end-row]] - xmean) - running_mean) / cnt;
        running_ssq    += w_this * (((x[ix_arr[end-row]] - xmean) - running_mean) * ((x[ix_arr[end-row]] - xmean) - mean_prev));
        mean_prev       =  running_mean;
        sd_arr[n-row-1] = (row == 0)? 0. : std::sqrt(running_ssq / cnt);
    }
    w_this = w[ix_arr[st]];
    cnt += w_this;
    running_mean   += ((x[ix_arr[st]] - xmean) - running_mean) / cnt;
    running_ssq    += w_this * (((x[ix_arr[st]] - xmean) - running_mean) * ((x[ix_arr[st]] - xmean) - mean_prev));
    cumw = cnt;
    return std::sqrt(running_ssq / cnt);
}